

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

uint stb_hashptr(void *p)

{
  uint uVar1;
  uint x;
  int iVar2;
  
  iVar2 = ((uint)p >> 0x13) + ((uint)((ulong)p >> 6) & 0x3ffffff) + (uint)p;
  uVar1 = iVar2 * 0x80008 ^ iVar2 * 0x10001;
  uVar1 = (uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 4 ^ uVar1;
  uVar1 = (uVar1 >> 0xf) + uVar1;
  uVar1 = uVar1 * 0x400 ^ uVar1;
  return (uVar1 >> 0x13) + (uVar1 >> 6) + uVar1;
}

Assistant:

unsigned int stb_hashptr(void *p)
{
   unsigned int x = (unsigned int) p;

   // typically lacking in low bits and high bits
   x = stb_rehash(x);
   x += x << 16;

   // pearson's shuffle
   x ^= x << 3;
   x += x >> 5;
   x ^= x << 2;
   x += x >> 15;
   x ^= x << 10;
   return stb_rehash(x);
}